

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_kv_append_fmt(unqlite *pDb,void *pKey,int nKeyLen,char *zFormat,...)

{
  unqlite_kv_engine *puVar1;
  char *pcVar2;
  char in_AL;
  int iVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  sxu32 local_11c;
  unqlite *local_118;
  void *local_110;
  undefined8 uStack_108;
  uint local_100;
  __va_list_tag local_f8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  iVar3 = -0x18;
  if ((pDb != (unqlite *)0x0) && (pDb->nMagic == 0xdb7c2712)) {
    puVar1 = ((pDb->sDB).pPager)->pEngine;
    local_b8 = in_R8;
    local_b0 = in_R9;
    if (puVar1->pIo->pMethods->xAppend ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      unqliteGenError(pDb,"xAppend() method not implemented in the underlying storage engine");
      iVar3 = -0x11;
    }
    else {
      if (nKeyLen < 0) {
        pcVar4 = (char *)pKey;
        if (*pKey != '\0') {
          pcVar2 = (char *)((long)pKey + 2);
          do {
            pcVar4 = pcVar2;
            if (pcVar4[-1] == '\0') {
              pcVar4 = pcVar4 + -1;
              goto LAB_0010db45;
            }
            if (*pcVar4 == '\0') goto LAB_0010db45;
            if (pcVar4[1] == '\0') {
              pcVar4 = pcVar4 + 1;
              goto LAB_0010db45;
            }
            pcVar2 = pcVar4 + 4;
          } while (pcVar4[2] != '\0');
          pcVar4 = pcVar4 + 2;
        }
LAB_0010db45:
        nKeyLen = (int)pcVar4 - (int)pKey;
      }
      if (nKeyLen == 0) {
        unqliteGenError(pDb,"Empty key");
        iVar3 = -3;
      }
      else {
        local_110 = (void *)0x0;
        uStack_108 = 0;
        local_100 = 0;
        local_f8.gp_offset = 0x20;
        local_f8.fp_offset = 0x30;
        local_f8.overflow_arg_area = &stack0x00000008;
        local_f8.reg_save_area = local_d8;
        local_118 = pDb;
        FormatMount(6,&local_118,(ProcConsumer)0x0,(void *)0x0,&local_11c,zFormat,&local_f8);
        iVar3 = (*puVar1->pIo->pMethods->xAppend)
                          (puVar1,pKey,nKeyLen,local_110,uStack_108 & 0xffffffff);
        if (((local_100 & 6) == 0) && (uStack_108._4_4_ != 0)) {
          SyMemBackendFree(&local_118->sMem,local_110);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int unqlite_kv_append_fmt(unqlite *pDb,const void *pKey,int nKeyLen,const char *zFormat,...)
{
	unqlite_kv_engine *pEngine;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 if( pEngine->pIo->pMethods->xAppend == 0 ){
		 /* Storage engine does not implement such method */
		 unqliteGenError(pDb,"xAppend() method not implemented in the underlying storage engine");
		 rc = UNQLITE_NOTIMPLEMENTED;
	 }else{
		 if( nKeyLen < 0 ){
			 /* Assume a null terminated string and compute it's length */
			 nKeyLen = SyStrlen((const char *)pKey);
		 }
		 if( !nKeyLen ){
			 unqliteGenError(pDb,"Empty key");
			 rc = UNQLITE_EMPTY;
		 }else{
			 SyBlob sWorker; /* Working buffer */
			 va_list ap;
			 SyBlobInit(&sWorker,&pDb->sMem);
			 /* Format the data */
			 va_start(ap,zFormat);
			 SyBlobFormatAp(&sWorker,zFormat,ap);
			 va_end(ap);
			 /* Perform the requested operation */
			 rc = pEngine->pIo->pMethods->xAppend(pEngine,pKey,nKeyLen,SyBlobData(&sWorker),SyBlobLength(&sWorker));
			 /* Clean up */
			 SyBlobRelease(&sWorker);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}